

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest11::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest11 *this,_test_case *test_case)

{
  _test_case _Var1;
  stringstream local_1a8 [8];
  stringstream result_sstream;
  ostream local_198;
  _test_case *local_20;
  _test_case *test_case_local;
  NegativeTest11 *this_local;
  
  local_20 = test_case;
  test_case_local = (_test_case *)this;
  this_local = (NegativeTest11 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,"#version 400\n\n#extension GL_ARB_shader_subroutine : require\n");
  if (*local_20 == TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT) {
    std::operator<<(&local_198,"#extension GL_ARB_shader_atomic_counters : require\n");
  }
  std::operator<<(&local_198,
                  "\nsubroutine void subroutineType(inout vec4 test);\n\nsubroutine(subroutineType) void test_function(inout vec4 test)\n{\n    test += vec4(0, 1, 2, 3);\n}\n\nsubroutine uniform subroutineType function;\n\nvoid main()\n{\n"
                 );
  _Var1 = *local_20;
  if (_Var1 == TEST_CASE_FIRST) {
    std::operator<<(&local_198,"gl_Position = texture(function, vec2(1.0) );\n");
  }
  else if (_Var1 == TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT) {
    std::operator<<(&local_198,
                    "if (atomicCounter(function) > 2)\n{\n    gl_Position = vec4(1);\n}\n");
  }
  else if (_Var1 == TEST_CASE_INVALID_IMAGE_FUNCTION_USAGE_ATTEMPT) {
    std::operator<<(&local_198,"imageStore(function, vec2(0.0, 1.0), vec4(1.0) );\n");
  }
  std::operator<<(&local_198,"}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest11::getVertexShader(const _test_case& test_case)
{
	std::stringstream result_sstream;

	/* Form pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n";

	if (test_case == TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT)
	{
		result_sstream << "#extension GL_ARB_shader_atomic_counters : require\n";
	}

	result_sstream << "\n"
					  /* Define a subroutine */
					  "subroutine void subroutineType(inout vec4 test);\n"
					  "\n"
					  "subroutine(subroutineType) void test_function(inout vec4 test)\n"
					  "{\n"
					  "    test += vec4(0, 1, 2, 3);\n"
					  "}\n"
					  "\n"
					  "subroutine uniform subroutineType function;\n"
					  "\n"

					  /* Define main() body */
					  "void main()\n"
					  "{\n";

	/* Implement case-specific behavior */
	switch (test_case)
	{
	case TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT:
	{
		result_sstream << "if (atomicCounter(function) > 2)\n"
						  "{\n"
						  "    gl_Position = vec4(1);\n"
						  "}\n";

		break;
	}

	case TEST_CASE_INVALID_IMAGE_FUNCTION_USAGE_ATTEMPT:
	{
		result_sstream << "imageStore(function, vec2(0.0, 1.0), vec4(1.0) );\n";

		break;
	}

	case TEST_CASE_INVALID_TEXTURE_SAMPLING_ATTEMPT:
	{
		result_sstream << "gl_Position = texture(function, vec2(1.0) );\n";

		break;
	}

	default:
		break;
	} /* switch (test_case) */

	/* Close main() body */
	result_sstream << "}\n";

	/* Done */
	return result_sstream.str();
}